

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undefined.cpp
# Opt level: O0

Variable __thiscall
LiteScript::_Type_UNDEFINED::ONotEqual(_Type_UNDEFINED *this,Variable *obj1,Variable *obj2)

{
  bool bVar1;
  Object *pOVar2;
  Type *this_00;
  bool *pbVar3;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  uint *extraout_RDX;
  Variable VVar4;
  Variable *obj2_local;
  Variable *obj1_local;
  _Type_UNDEFINED *this_local;
  Variable *res;
  
  pOVar2 = Variable::operator->(obj2);
  Memory::Create((Memory *)this,(Type *)pOVar2->memory);
  pOVar2 = Variable::operator->((Variable *)CONCAT71(in_register_00000009,in_CL));
  this_00 = Object::GetType(pOVar2);
  bVar1 = Type::operator!=(this_00,(Type *)obj1);
  pOVar2 = Variable::operator->((Variable *)this);
  pbVar3 = Object::GetData<bool>(pOVar2);
  *pbVar3 = bVar1;
  VVar4.nb_ref = extraout_RDX;
  VVar4.obj = (Object *)this;
  return VVar4;
}

Assistant:

LiteScript::Variable LiteScript::_Type_UNDEFINED::ONotEqual(const Variable &obj1, const Variable &obj2) const {
    Variable res = obj1->memory.Create(Type::BOOLEAN);
    res->GetData<bool>() = (obj2->GetType() != *this);
    return res;
}